

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_decoder.c
# Opt level: O1

lzma_ret stream_decoder_memconfig
                   (lzma_coder_conflict1 *coder,uint64_t *memusage,uint64_t *old_memlimit,
                   uint64_t new_memlimit)

{
  lzma_ret lVar1;
  
  *memusage = coder->memusage;
  *old_memlimit = coder->memlimit;
  lVar1 = LZMA_OK;
  if ((new_memlimit != 0) && (lVar1 = LZMA_MEMLIMIT_ERROR, coder->memusage <= new_memlimit)) {
    coder->memlimit = new_memlimit;
    lVar1 = LZMA_OK;
  }
  return lVar1;
}

Assistant:

static lzma_ret
stream_decoder_memconfig(lzma_coder *coder, uint64_t *memusage,
		uint64_t *old_memlimit, uint64_t new_memlimit)
{
	*memusage = coder->memusage;
	*old_memlimit = coder->memlimit;

	if (new_memlimit != 0) {
		if (new_memlimit < coder->memusage)
			return LZMA_MEMLIMIT_ERROR;

		coder->memlimit = new_memlimit;
	}

	return LZMA_OK;
}